

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O0

ssize_t __thiscall InputSource::read(InputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  qpdf_offset_t at_local;
  size_t count_local;
  string *str_local;
  InputSource *this_local;
  
  if (-1 < (long)__nbytes) {
    (*this->_vptr_InputSource[5])(this,__nbytes,0);
  }
  std::__cxx11::string::resize(CONCAT44(in_register_00000034,__fd));
  uVar1 = std::__cxx11::string::data();
  (*this->_vptr_InputSource[7])(this,uVar1,__buf);
  std::__cxx11::string::resize(CONCAT44(in_register_00000034,__fd));
  sVar2 = std::__cxx11::string::size();
  return sVar2;
}

Assistant:

inline size_t
InputSource::read(std::string& str, size_t count, qpdf_offset_t at)
{
    if (at >= 0) {
        seek(at, SEEK_SET);
    }
    str.resize(count);
    str.resize(read(str.data(), count));
    return str.size();
}